

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddErrorSchemaLocation
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,ValueType *result,PointerType *schema)

{
  SizeType SVar1;
  SchemaType *pSVar2;
  SValue *pSVar3;
  Ch *pCVar4;
  Ch *__src;
  size_t sVar5;
  CrtAllocator *pCVar6;
  StringRefType *rhs;
  GenericStringRef<char> local_c0;
  undefined1 local_b0 [8];
  ValueType schemaRef;
  undefined1 local_50 [4];
  SizeType len;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> sb;
  PointerType *schema_local;
  ValueType *result_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  sb.stack_.initialCapacity_ = (size_t)schema;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericStringBuffer
            ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_50,
             (CrtAllocator *)0x0,0x100);
  pSVar2 = CurrentSchema(this);
  pSVar3 = internal::
           Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           ::GetURI(pSVar2);
  SVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength(pSVar3);
  if (SVar1 != 0) {
    pCVar4 = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Push
                       ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                        local_50,(ulong)SVar1);
    pSVar2 = CurrentSchema(this);
    pSVar3 = internal::
             Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             ::GetURI(pSVar2);
    __src = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString(pSVar3);
    memcpy(pCVar4,__src,(ulong)SVar1);
  }
  sVar5 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::GetTokenCount(schema);
  if (sVar5 == 0) {
    GetInvalidSchemaPointer((PointerType *)((long)&schemaRef.data_ + 8),this);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::
    StringifyUriFragment<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
              ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                *)(schemaRef.data_.ss.str + 8),
               (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_50);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)((long)&schemaRef.data_ + 8));
  }
  else {
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::
    StringifyUriFragment<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
              ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                *)schema,
               (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_50);
  }
  pCVar4 = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      local_50);
  sVar5 = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetSize
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_50
                    );
  pCVar6 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_b0,pCVar4,
             (SizeType)sVar5,pCVar6);
  rhs = GetSchemaRefString();
  GenericStringRef<char>::GenericStringRef(&local_c0,rhs);
  pCVar6 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (result,&local_c0,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_b0,pCVar6);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_b0);
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericStringBuffer
            ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_50);
  return;
}

Assistant:

void AddErrorSchemaLocation(ValueType& result, PointerType schema = PointerType()) {
        GenericStringBuffer<EncodingType> sb;
        SizeType len = CurrentSchema().GetURI().GetStringLength();
        if (len) memcpy(sb.Push(len), CurrentSchema().GetURI().GetString(), len * sizeof(Ch));
        if (schema.GetTokenCount()) schema.StringifyUriFragment(sb);
        else GetInvalidSchemaPointer().StringifyUriFragment(sb);
        ValueType schemaRef(sb.GetString(), static_cast<SizeType>(sb.GetSize() / sizeof(Ch)),
            GetStateAllocator());
        result.AddMember(GetSchemaRefString(), schemaRef, GetStateAllocator());
    }